

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ForkJoin.cpp
# Opt level: O2

string * __thiscall
amrex::ForkJoin::get_io_filename_abi_cxx11_
          (string *__return_storage_ptr__,ForkJoin *this,bool flag_unique)

{
  int iVar1;
  bool bVar2;
  int __val;
  int i;
  long lVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  _Vector_base<int,_std::allocator<int>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  string result_base;
  string local_298 [32];
  string local_278;
  string local_258 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  int aiStack_218 [122];
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_238);
  bVar2 = std::operator!=(&this->task_output_dir,"");
  if (bVar2) {
    std::__cxx11::string::string((string *)&result_base,(string *)&this->task_output_dir);
    local_2f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar4 = 0x50;
    for (lVar3 = 1; lVar3 < (DAT_006e0650 - ParallelContext::frames) / 0x48; lVar3 = lVar3 + 1) {
      local_238._M_dataplus._M_p._0_4_ = *(undefined4 *)(ParallelContext::frames + lVar4);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)&local_2f8,(int *)&local_238);
      lVar4 = lVar4 + 0x48;
    }
    std::__cxx11::string::string(local_298,"-",(allocator *)&local_278);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    bVar2 = true;
    for (lVar3 = 0;
        lVar3 < (long)local_2f8._M_impl.super__Vector_impl_data._M_finish -
                (long)local_2f8._M_impl.super__Vector_impl_data._M_start >> 2; lVar3 = lVar3 + 1) {
      if (!bVar2) {
        std::operator<<((ostream *)&local_238,local_298);
      }
      std::ostream::operator<<(&local_238,local_2f8._M_impl.super__Vector_impl_data._M_start[lVar3])
      ;
      bVar2 = false;
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
    std::operator+(&local_318,"/T-",&local_2d8);
    std::__cxx11::string::append((string *)&result_base);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string(local_298);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2f8);
    std::__cxx11::to_string(&local_318,*(int *)(DAT_006e0650 + -0x3c));
    std::operator+(&local_238,".R-",&local_318);
    std::__cxx11::string::append((string *)&result_base);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_318);
    if (flag_unique) {
      __val = 0;
      do {
        std::operator+(&local_2d8,&result_base,".I-");
        std::__cxx11::to_string(&local_278,__val);
        std::operator+(&local_318,&local_2d8,&local_278);
        std::operator+(&local_238,&local_318,".out");
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_238);
        std::__cxx11::string::~string((string *)&local_238);
        std::__cxx11::string::~string((string *)&local_318);
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::__cxx11::string::string(local_258,(string *)__return_storage_ptr__);
        std::ifstream::ifstream(&local_238,local_258,_S_in);
        iVar1 = *(int *)((long)aiStack_218 +
                        *(long *)(CONCAT44(local_238._M_dataplus._M_p._4_4_,
                                           local_238._M_dataplus._M_p._0_4_) + -0x18));
        std::ifstream::~ifstream(&local_238);
        std::__cxx11::string::~string(local_258);
        __val = __val + 1;
      } while (iVar1 == 0);
    }
    else {
      std::operator+(&local_238,&result_base,".out");
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_238);
      std::__cxx11::string::~string((string *)&local_238);
    }
    std::__cxx11::string::~string((string *)&result_base);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
ForkJoin::get_io_filename (bool flag_unique)
{
    std::string result = "";

    if (task_output_dir != "") {
        // build base filename
        std::string result_base = task_output_dir;
        result_base += "/T-" + str_join(get_frame_id_vec(), "-");
        result_base += ".R-" + std::to_string(ParallelContext::MyProcSub());

        if (flag_unique) {
            // concatenate an integer to the end to make unique
            int i = 0;
            do {
                result = result_base + ".I-" + std::to_string(i++) + ".out";
            } while (file_exists(result));
        } else {
            result = result_base + ".out";
        }
    }

    return result;
}